

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::BufferTextureStorageTestCase::execute
          (BufferTextureStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  GLenum GVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  int iVar3;
  byte local_1e9;
  uint local_1e0;
  uint local_1dc;
  MessageBuilder local_1c0;
  uint local_3c;
  void *pvStack_38;
  uint n_texel;
  uint *ssbo_data_ptr;
  uint current_tb_offset;
  uint tbo_commit_size;
  uint tbo_commit_start_offset;
  uint uStack_1c;
  bool result_local;
  int n_entry_point;
  uint n_iteration;
  bool result;
  BufferTextureStorageTestCase *pBStack_10;
  GLuint sparse_bo_storage_flags_local;
  BufferTextureStorageTestCase *this_local;
  
  n_entry_point._3_1_ = 1;
  n_iteration = sparse_bo_storage_flags;
  pBStack_10 = this;
  (*this->m_gl->useProgram)(this->m_po);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x51a);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x51f);
  for (uStack_1c = 0; uStack_1c < 2; uStack_1c = uStack_1c + 1) {
    tbo_commit_start_offset = 0;
    while( true ) {
      iVar3 = 1;
      if ((this->m_is_texture_buffer_range_supported & 1U) != 0) {
        iVar3 = 2;
      }
      if (iVar3 <= (int)tbo_commit_start_offset) break;
      tbo_commit_size._3_1_ = 1;
      if (uStack_1c == 0) {
        local_1dc = 0;
      }
      else {
        local_1dc = this->m_sparse_bo_size_rounded >> 1;
      }
      current_tb_offset = local_1dc;
      if (uStack_1c == 0) {
        local_1e0 = this->m_sparse_bo_size_rounded;
      }
      else {
        local_1e0 = this->m_sparse_bo_size_rounded >> 1;
      }
      ssbo_data_ptr._4_4_ = local_1e0;
      (*this->m_gl->bindBuffer)(0x8c2a,this->m_sparse_bo);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x533);
      (*this->m_gl->bufferPageCommitmentARB)
                (0x8c2a,(ulong)current_tb_offset,(ulong)ssbo_data_ptr._4_4_,'\x01');
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x537);
      if (tbo_commit_start_offset == 0) {
        (*this->m_gl->texBuffer)(0x8c2a,0x8058,this->m_sparse_bo);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glTexBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x53e);
      }
      else {
        (*this->m_gl->texBufferRange)
                  (0x8c2a,0x8058,this->m_sparse_bo,0,(ulong)this->m_sparse_bo_size);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glTexBufferRange() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x545);
      }
      (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_helper_bo_data_size);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x54c);
      (*this->m_gl->dispatchCompute)(this->m_to_width / this->m_po_local_wg_size,1,1);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glDispatchCompute() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x553);
      (*this->m_gl->memoryBarrier)(0x200);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glMemoryBarrier() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x557);
      ssbo_data_ptr._0_4_ = 0;
      pvStack_38 = (*this->m_gl->mapBuffer)(0x90d2,35000);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glMapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x55f);
      local_3c = 0;
      while( true ) {
        local_1e9 = 0;
        if (local_3c < this->m_to_width) {
          local_1e9 = tbo_commit_size._3_1_;
        }
        if ((local_1e9 & 1) == 0) break;
        if (((current_tb_offset <= (uint)ssbo_data_ptr) &&
            ((uint)ssbo_data_ptr < current_tb_offset + ssbo_data_ptr._4_4_)) &&
           (*(int *)((long)pvStack_38 + (ulong)(local_3c << 2) * 4) != 1)) {
          this_00 = tcu::TestContext::getLog(this->m_testCtx);
          tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar2 = tcu::MessageBuilder::operator<<
                             (&local_1c0,
                              (char (*) [48])"A texel read from the texture buffer at index [");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_3c);
          pMVar2 = tcu::MessageBuilder::operator<<
                             (pMVar2,(char (*) [46])"] was marked as invalid by the CS invocation.")
          ;
          tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1c0);
          tbo_commit_size._3_1_ = 0;
        }
        local_3c = local_3c + 1;
        ssbo_data_ptr._0_4_ = (uint)ssbo_data_ptr + 4;
      }
      n_entry_point._3_1_ = (n_entry_point._3_1_ & 1 & tbo_commit_size._3_1_ & 1) != 0;
      (*this->m_gl->unmapBuffer)(0x90d2);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x576);
      (*this->m_gl->bufferPageCommitmentARB)(0x8c2a,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x57c);
      (*this->m_gl->bufferSubData)
                (0x90d2,0,(ulong)this->m_ssbo_zero_data_size,this->m_ssbo_zero_data);
      GVar1 = (*this->m_gl->getError)();
      glu::checkError(GVar1,"glBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x581);
      tbo_commit_start_offset = tbo_commit_start_offset + 1;
    }
  }
  return (bool)(n_entry_point._3_1_ & 1);
}

Assistant:

bool BufferTextureStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	/* Bind the program object */
	m_gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

	/* Set up bindings for the copy ops */
	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

	/* Run the test in two iterations:
	 *
	 * a) All required pages are committed.
	 * b) Only half of the pages are committed. */
	for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
	{

		/* Test glTexBuffer() and glTexBufferRange() separately. */
		for (int n_entry_point = 0; n_entry_point < (m_is_texture_buffer_range_supported ? 2 : 1); ++n_entry_point)
		{
			bool result_local = true;

			/* Set up the sparse buffer's memory backing. */
			const unsigned int tbo_commit_start_offset = (n_iteration == 0) ? 0 : m_sparse_bo_size_rounded / 2;
			const unsigned int tbo_commit_size =
				(n_iteration == 0) ? m_sparse_bo_size_rounded : m_sparse_bo_size_rounded / 2;

			m_gl.bindBuffer(GL_TEXTURE_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

			m_gl.bufferPageCommitmentARB(GL_TEXTURE_BUFFER, tbo_commit_start_offset, tbo_commit_size,
										 GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			/* Set up the buffer texture's backing */
			if (n_entry_point == 0)
			{
				m_gl.texBuffer(GL_TEXTURE_BUFFER, GL_RGBA8, m_sparse_bo);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexBuffer() call failed.");
			}
			else
			{
				m_gl.texBufferRange(GL_TEXTURE_BUFFER, GL_RGBA8, m_sparse_bo, 0, /* offset */
									m_sparse_bo_size);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexBufferRange() call failed.");
			}

			/* Set up the sparse buffer's data storage */
			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
								   0,											 /* writeOffset */
								   m_helper_bo_data_size);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			/* Run the compute program */
			DE_ASSERT((m_to_width % m_po_local_wg_size) == 0);

			m_gl.dispatchCompute(m_to_width / m_po_local_wg_size, 1, /* num_groups_y */
								 1);								 /* num_groups_z */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDispatchCompute() call failed.");

			/* Flush the caches */
			m_gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMemoryBarrier() call failed.");

			/* Map the SSBO into process space, so we can check if the texture buffer's
			 * contents was found valid by the compute shader */
			unsigned int		current_tb_offset = 0;
			const unsigned int* ssbo_data_ptr =
				(const unsigned int*)m_gl.mapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

			for (unsigned int n_texel = 0; n_texel < m_to_width && result_local;
				 ++n_texel, current_tb_offset += 4 /* rgba */)
			{
				/* NOTE: Since the CS uses std140 layout, we need to move by 4 ints for
				 *       each result value */
				if (current_tb_offset >= tbo_commit_start_offset &&
					current_tb_offset < (tbo_commit_start_offset + tbo_commit_size) && ssbo_data_ptr[n_texel * 4] != 1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A texel read from the texture buffer at index "
																   "["
									   << n_texel << "]"
													 " was marked as invalid by the CS invocation."
									   << tcu::TestLog::EndMessage;

					result_local = false;
				} /* if (ssbo_data_ptr[n_texel] != 1) */
			}	 /* for (all result values) */

			result &= result_local;

			m_gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

			/* Remove the physical backing from the sparse buffer  */
			m_gl.bufferPageCommitmentARB(GL_TEXTURE_BUFFER, 0,				  /* offset */
										 m_sparse_bo_size_rounded, GL_FALSE); /* commit */

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			/* Reset SSBO's contents */
			m_gl.bufferSubData(GL_SHADER_STORAGE_BUFFER, 0, /* offset */
							   m_ssbo_zero_data_size, m_ssbo_zero_data);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");
		} /* for (both entry-points) */
	}	 /* for (both iterations) */

	return result;
}